

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentStack.h
# Opt level: O0

void __thiscall ConcurrentStack<int>::push(ConcurrentStack<int> *this,int *item)

{
  size_type sVar1;
  ostream *this_00;
  bool bVar2;
  undefined1 local_28 [8];
  unique_lock<std::mutex> mlock;
  int *item_local;
  ConcurrentStack<int> *this_local;
  
  mlock._8_8_ = item;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mutex_);
  while( true ) {
    bVar2 = false;
    if ((this->bounded_ & 1U) != 0) {
      sVar1 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::size(&this->stack_);
      bVar2 = this->max_size_ <= sVar1;
    }
    if (!bVar2) break;
    this_00 = std::operator<<((ostream *)&std::cout,"Can\'t push : queue is full !\n");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
              (&this->queue_full_,(unique_lock<std::mutex> *)local_28,&this->timeout_);
  }
  std::stack<int,std::deque<int,std::allocator<int>>>::emplace<int_const>
            ((stack<int,std::deque<int,std::allocator<int>>> *)this,(int *)mlock._8_8_);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void push(const T&& item) {
        {
            std::unique_lock<std::mutex> mlock(mutex_);
            while (bounded_ && stack_.size() >= max_size_) {
                std::cout  << "Can't push : queue is full !\n" << std::endl;
                queue_full_.wait_for(mlock, timeout_);
            }
            stack_.emplace(std::move(item));
        }
        queue_empty_.notify_one();
    }